

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

size_t mg_websocket_printf(mg_connection *conn,int opcode,char *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_1168 [24];
  undefined8 local_1150;
  undefined8 local_1148;
  undefined8 local_1140;
  undefined8 local_1138;
  undefined8 local_1128;
  undefined8 local_1118;
  undefined8 local_1108;
  undefined8 local_10f8;
  undefined8 local_10e8;
  undefined8 local_10d8;
  undefined8 local_10c8;
  int local_10ac;
  undefined1 local_10a8 [4];
  int len;
  va_list ap;
  char *buf;
  char mem [4192];
  char *fmt_local;
  int opcode_local;
  mg_connection *conn_local;
  
  if (in_AL != '\0') {
    local_1138 = in_XMM0_Qa;
    local_1128 = in_XMM1_Qa;
    local_1118 = in_XMM2_Qa;
    local_1108 = in_XMM3_Qa;
    local_10f8 = in_XMM4_Qa;
    local_10e8 = in_XMM5_Qa;
    local_10d8 = in_XMM6_Qa;
    local_10c8 = in_XMM7_Qa;
  }
  ap[0].reg_save_area = &buf;
  ap[0].overflow_arg_area = local_1168;
  ap[0]._0_8_ = &stack0x00000008;
  len = 0x30;
  local_10a8 = (undefined1  [4])0x18;
  local_1150 = in_RCX;
  local_1148 = in_R8;
  local_1140 = in_R9;
  local_10ac = ns_avprintf((char **)&ap[0].reg_save_area,0x1060,fmt,(__va_list_tag *)local_10a8);
  if (0 < local_10ac) {
    mg_websocket_write(conn,opcode,(char *)ap[0].reg_save_area,(long)local_10ac);
  }
  if (((char **)ap[0].reg_save_area != &buf) && (ap[0].reg_save_area != (void *)0x0)) {
    free(ap[0].reg_save_area);
  }
  return *(size_t *)((long)conn[-1].callback_param + 0x58);
}

Assistant:

size_t mg_websocket_printf(struct mg_connection *conn, int opcode,
                           const char *fmt, ...) {
  char mem[4192], *buf = mem;
  va_list ap;
  int len;

  va_start(ap, fmt);
  if ((len = ns_avprintf(&buf, sizeof(mem), fmt, ap)) > 0) {
    mg_websocket_write(conn, opcode, buf, len);
  }
  va_end(ap);

  if (buf != mem && buf != NULL) {
    free(buf);
  }

  return MG_CONN_2_CONN(conn)->ns_conn->send_iobuf.len;
}